

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_regtest.c
# Opt level: O3

void printUsage(void)

{
  puts("Usage: ta_regtest [-p]");
  putchar(10);
  puts("   No parameter needed for regression testing.");
  putchar(10);
  puts("   This tool will execute a series of tests to");
  puts("   make sure that the library is behaving as");
  puts("   expected.");
  putchar(10);
  puts("   ** Must be run from the \'bin\' directory.");
  putchar(10);
  puts("   OPTION:");
  puts("    -p Only generate profiling data on stdout. This is");
  puts("       intended only for the TA-Lib developers. It is");
  puts("       not further documented for general use.");
  putchar(10);
  puts("   On success, the exit code is 0.");
  puts("   On failure, the exit code is a number that can be");
  puts("   found in c/src/tools/ta_regtest/ta_error_number.h");
  return;
}

Assistant:

static void printUsage(void)
{
      printf( "Usage: ta_regtest [-p]\n" );
      printf( "\n" );
      printf( "   No parameter needed for regression testing.\n" );
      printf( "\n" );
      printf( "   This tool will execute a series of tests to\n" );
      printf( "   make sure that the library is behaving as\n" );
      printf( "   expected.\n");
	  printf( "\n" );
      printf( "   ** Must be run from the 'bin' directory.\n" );
      printf( "\n" );
	  printf( "   OPTION:\n" );
      printf( "    -p Only generate profiling data on stdout. This is\n" );
      printf( "       intended only for the TA-Lib developers. It is\n" );
      printf( "       not further documented for general use.\n" );
      printf( "\n" );
      printf( "   On success, the exit code is 0.\n" );
      printf( "   On failure, the exit code is a number that can be\n" );
      printf( "   found in c/src/tools/ta_regtest/ta_error_number.h\n" );
}